

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cpp
# Opt level: O2

bool wallet::CreateFromDump
               (ArgsManager *args,string *name,path *wallet_path,bilingual_str *error,
               vector<bilingual_str,_std::allocator<bilingual_str>_> *warnings)

{
  long lVar1;
  string original;
  bool bVar2;
  DatabaseBatch *pDVar3;
  bool bVar4;
  __type_conflict1 _Var5;
  DBErrors DVar6;
  CWallet *this;
  WalletDatabase *pWVar7;
  string *psVar8;
  uint32_t *args_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_01;
  char *args_02;
  bilingual_str *pbVar9;
  DatabaseOptions *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  undefined8 uVar11;
  long in_FS_OFFSET;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  undefined1 auStack_5c8 [12];
  vector<unsigned_char,_std::allocator<unsigned_char>_> v;
  vector<unsigned_char,_std::allocator<unsigned_char>_> k;
  DatabaseBatch *local_580;
  long *local_578;
  shared_ptr<wallet::CWallet> wallet;
  long *local_560;
  DatabaseStatus status;
  uint32_t ver;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock3;
  string line;
  string local_520 [32];
  string value;
  string key;
  vector<unsigned_char,_std::allocator<unsigned_char>_> parsed_checksum;
  DatabaseOptions options;
  string format_hasher_line;
  string file_format;
  string format_value;
  string format_key;
  string magic_hasher_line;
  undefined1 local_398 [64];
  string version_value;
  string magic_key;
  uint256 checksum;
  HashWriter hasher;
  ifstream dump_file;
  int aiStack_268 [122];
  path dump_path;
  string dump_filename;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)warnings;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dump_file,"-dumpfile",(allocator<char> *)&options);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&hasher,"",(allocator<char> *)local_398);
  psVar8 = (string *)&hasher;
  ArgsManager::GetArg(&dump_filename,args,(string *)&dump_file,psVar8);
  std::__cxx11::string::~string((string *)&hasher);
  std::__cxx11::string::~string((string *)&dump_file);
  if (dump_filename._M_string_length == 0) {
    _((bilingual_str *)&dump_file,(ConstevalStringLiteral)0x3dcdb0);
    bilingual_str::operator=(error,(bilingual_str *)&dump_file);
    bilingual_str::~bilingual_str((bilingual_str *)&dump_file);
    bVar4 = false;
    goto LAB_0013e1ab;
  }
  fs::PathFromString(&dump_path,&dump_filename);
  fs::absolute((path *)&dump_file,&dump_path);
  std::filesystem::__cxx11::path::operator=(&dump_path.super_path,(path *)&dump_file);
  std::filesystem::__cxx11::path::~path((path *)&dump_file);
  bVar4 = std::filesystem::exists(&dump_path.super_path);
  if (bVar4) {
    std::ifstream::ifstream(&dump_file,dump_path.super_path._M_pathname._M_dataplus._M_p,_S_in);
    hasher.ctx.buf[0x30] = '\0';
    hasher.ctx.buf[0x31] = '\0';
    hasher.ctx.buf[0x32] = '\0';
    hasher.ctx.buf[0x33] = '\0';
    hasher.ctx.buf[0x34] = '\0';
    hasher.ctx.buf[0x35] = '\0';
    hasher.ctx.buf[0x36] = '\0';
    hasher.ctx.buf[0x37] = '\0';
    hasher.ctx.buf[0x38] = '\0';
    hasher.ctx.buf[0x39] = '\0';
    hasher.ctx.buf[0x3a] = '\0';
    hasher.ctx.buf[0x3b] = '\0';
    hasher.ctx.buf[0x3c] = '\0';
    hasher.ctx.buf[0x3d] = '\0';
    hasher.ctx.buf[0x3e] = '\0';
    hasher.ctx.buf[0x3f] = '\0';
    hasher.ctx.buf[0x20] = '\0';
    hasher.ctx.buf[0x21] = '\0';
    hasher.ctx.buf[0x22] = '\0';
    hasher.ctx.buf[0x23] = '\0';
    hasher.ctx.buf[0x24] = '\0';
    hasher.ctx.buf[0x25] = '\0';
    hasher.ctx.buf[0x26] = '\0';
    hasher.ctx.buf[0x27] = '\0';
    hasher.ctx.buf[0x28] = '\0';
    hasher.ctx.buf[0x29] = '\0';
    hasher.ctx.buf[0x2a] = '\0';
    hasher.ctx.buf[0x2b] = '\0';
    hasher.ctx.buf[0x2c] = '\0';
    hasher.ctx.buf[0x2d] = '\0';
    hasher.ctx.buf[0x2e] = '\0';
    hasher.ctx.buf[0x2f] = '\0';
    hasher.ctx.buf[0x10] = '\0';
    hasher.ctx.buf[0x11] = '\0';
    hasher.ctx.buf[0x12] = '\0';
    hasher.ctx.buf[0x13] = '\0';
    hasher.ctx.buf[0x14] = '\0';
    hasher.ctx.buf[0x15] = '\0';
    hasher.ctx.buf[0x16] = '\0';
    hasher.ctx.buf[0x17] = '\0';
    hasher.ctx.buf[0x18] = '\0';
    hasher.ctx.buf[0x19] = '\0';
    hasher.ctx.buf[0x1a] = '\0';
    hasher.ctx.buf[0x1b] = '\0';
    hasher.ctx.buf[0x1c] = '\0';
    hasher.ctx.buf[0x1d] = '\0';
    hasher.ctx.buf[0x1e] = '\0';
    hasher.ctx.buf[0x1f] = '\0';
    hasher.ctx.buf[0] = '\0';
    hasher.ctx.buf[1] = '\0';
    hasher.ctx.buf[2] = '\0';
    hasher.ctx.buf[3] = '\0';
    hasher.ctx.buf[4] = '\0';
    hasher.ctx.buf[5] = '\0';
    hasher.ctx.buf[6] = '\0';
    hasher.ctx.buf[7] = '\0';
    hasher.ctx.buf[8] = '\0';
    hasher.ctx.buf[9] = '\0';
    hasher.ctx.buf[10] = '\0';
    hasher.ctx.buf[0xb] = '\0';
    hasher.ctx.buf[0xc] = '\0';
    hasher.ctx.buf[0xd] = '\0';
    hasher.ctx.buf[0xe] = '\0';
    hasher.ctx.buf[0xf] = '\0';
    hasher.ctx.s[4] = 0;
    hasher.ctx.s[5] = 0;
    hasher.ctx.s[6] = 0;
    hasher.ctx.s[7] = 0;
    hasher.ctx.s[0] = 0;
    hasher.ctx.s[1] = 0;
    hasher.ctx.s[2] = 0;
    hasher.ctx.s[3] = 0;
    hasher.ctx.bytes = 0;
    CSHA256::CSHA256(&hasher.ctx);
    checksum.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    checksum.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    checksum.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    checksum.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    checksum.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    checksum.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    checksum.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    checksum.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    checksum.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    checksum.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    checksum.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    checksum.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    checksum.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    checksum.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    checksum.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    checksum.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    checksum.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    checksum.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    checksum.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    checksum.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    checksum.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    checksum.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    checksum.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    checksum.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    checksum.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    checksum.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    checksum.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    checksum.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    checksum.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    checksum.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    checksum.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    checksum.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    magic_key._M_dataplus._M_p = (pointer)&magic_key.field_2;
    magic_key._M_string_length = 0;
    magic_key.field_2._M_local_buf[0] = '\0';
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&dump_file,(string *)&magic_key,',');
    version_value._M_dataplus._M_p = (pointer)&version_value.field_2;
    version_value._M_string_length = 0;
    version_value.field_2._M_local_buf[0] = '\0';
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&dump_file,(string *)&version_value,'\n');
    _Var5 = std::operator==(&magic_key,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            DUMP_MAGIC_abi_cxx11_);
    if (_Var5) {
      str._M_str = version_value._M_dataplus._M_p;
      str._M_len = version_value._M_string_length;
      bVar4 = ParseUInt32(str,&ver);
      if (!bVar4) {
        _((bilingual_str *)local_398,(ConstevalStringLiteral)0x3dce6b);
        tinyformat::format<std::__cxx11::string>
                  ((bilingual_str *)&options,(tinyformat *)local_398,(bilingual_str *)&version_value
                   ,psVar8);
LAB_0013e140:
        bilingual_str::operator=(error,(bilingual_str *)&options);
        bilingual_str::~bilingual_str((bilingual_str *)&options);
        bilingual_str::~bilingual_str((bilingual_str *)local_398);
        std::ifstream::close();
        goto LAB_0013e175;
      }
      args_00 = &DUMP_VERSION;
      if (ver != DUMP_VERSION) {
        _((bilingual_str *)local_398,(ConstevalStringLiteral)0x3dce9b);
        tinyformat::format<std::__cxx11::string>
                  ((bilingual_str *)&options,(tinyformat *)local_398,(bilingual_str *)&version_value
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_00);
        goto LAB_0013e140;
      }
      args_01 = &version_value;
      tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                (&magic_hasher_line,(tinyformat *)"%s,%s\n",(char *)&magic_key,args_01,pbVar10);
      options.require_existing = SUB81(magic_hasher_line._M_dataplus._M_p,0);
      options.require_create = SUB81((ulong)magic_hasher_line._M_dataplus._M_p >> 8,0);
      options._2_2_ = SUB82((ulong)magic_hasher_line._M_dataplus._M_p >> 0x10,0);
      options.require_format.super__Optional_base<wallet::DatabaseFormat,_true,_true>._M_payload.
      super__Optional_payload_base<wallet::DatabaseFormat>._M_payload._M_value =
           (DatabaseFormat)((ulong)magic_hasher_line._M_dataplus._M_p >> 0x20);
      options.require_format.super__Optional_base<wallet::DatabaseFormat,_true,_true>._M_payload.
      super__Optional_payload_base<wallet::DatabaseFormat>._4_4_ =
           SUB84(magic_hasher_line._M_string_length,0);
      options._12_4_ = SUB84(magic_hasher_line._M_string_length >> 0x20,0);
      HashWriter::operator<<(&hasher,(Span<char> *)&options);
      format_key._M_dataplus._M_p = (pointer)&format_key.field_2;
      format_key._M_string_length = 0;
      format_key.field_2._M_local_buf[0] = '\0';
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&dump_file,(string *)&format_key,',');
      format_value._M_dataplus._M_p = (pointer)&format_value.field_2;
      format_value._M_string_length = 0;
      format_value.field_2._M_local_buf[0] = '\0';
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&dump_file,(string *)&format_value,'\n');
      bVar4 = std::operator==(&format_key,"format");
      if (bVar4) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&options,"-format",(allocator<char> *)local_398);
        psVar8 = &format_value;
        ArgsManager::GetArg(&file_format,args,(string *)&options,psVar8);
        std::__cxx11::string::~string((string *)&options);
        if (file_format._M_string_length == 0) {
          _((bilingual_str *)&options,(ConstevalStringLiteral)0x3dcf6d);
          this_00 = &options;
          bilingual_str::operator=(error,(bilingual_str *)this_00);
LAB_0013e27a:
          bilingual_str::~bilingual_str((bilingual_str *)this_00);
          bVar4 = false;
        }
        else {
          uVar11 = 0x100000000;
          bVar4 = std::operator==(&file_format,"bdb");
          if (!bVar4) {
            bVar4 = std::operator==(&file_format,"sqlite");
            if (bVar4) {
              uVar11 = 0x100000001;
            }
            else {
              bVar4 = std::operator==(&file_format,"bdb_swap");
              if (!bVar4) {
                _((bilingual_str *)local_398,(ConstevalStringLiteral)0x3dcfd0);
                tinyformat::format<std::__cxx11::string>
                          ((bilingual_str *)&options,(tinyformat *)local_398,
                           (bilingual_str *)&file_format,psVar8);
                bilingual_str::operator=(error,(bilingual_str *)&options);
                bilingual_str::~bilingual_str((bilingual_str *)&options);
                this_00 = (DatabaseOptions *)local_398;
                goto LAB_0013e27a;
              }
              uVar11 = 0x100000003;
            }
          }
          _Var5 = std::operator==(&file_format,&format_value);
          if (!_Var5) {
            _((bilingual_str *)local_398,(ConstevalStringLiteral)0x3dd023);
            tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                      ((bilingual_str *)&options,(tinyformat *)local_398,
                       (bilingual_str *)&format_value,&file_format,pbVar10);
            std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                      (warnings,(bilingual_str *)&options);
            bilingual_str::~bilingual_str((bilingual_str *)&options);
            bilingual_str::~bilingual_str((bilingual_str *)local_398);
          }
          tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                    (&format_hasher_line,(tinyformat *)"%s,%s\n",(char *)&format_key,&format_value,
                     pbVar10);
          options.require_existing = SUB81(format_hasher_line._M_dataplus._M_p,0);
          options.require_create = SUB81((ulong)format_hasher_line._M_dataplus._M_p >> 8,0);
          options._2_2_ = SUB82((ulong)format_hasher_line._M_dataplus._M_p >> 0x10,0);
          options.require_format.super__Optional_base<wallet::DatabaseFormat,_true,_true>._M_payload
          .super__Optional_payload_base<wallet::DatabaseFormat>._M_payload._M_value =
               (DatabaseFormat)((ulong)format_hasher_line._M_dataplus._M_p >> 0x20);
          options.require_format.super__Optional_base<wallet::DatabaseFormat,_true,_true>._M_payload
          .super__Optional_payload_base<wallet::DatabaseFormat>._4_4_ =
               SUB84(format_hasher_line._M_string_length,0);
          options._12_4_ = SUB84(format_hasher_line._M_string_length >> 0x20,0);
          HashWriter::operator<<(&hasher,(Span<char> *)&options);
          options.require_existing = false;
          options.require_create = false;
          options.require_format.super__Optional_base<wallet::DatabaseFormat,_true,_true>._M_payload
          .super__Optional_payload_base<wallet::DatabaseFormat>._4_4_ =
               options.require_format.super__Optional_base<wallet::DatabaseFormat,_true,_true>.
               _M_payload.super__Optional_payload_base<wallet::DatabaseFormat>._4_4_ & 0xffffff00;
          options.create_flags = 0;
          options.create_passphrase._M_dataplus._M_p = (pointer)&options.create_passphrase.field_2;
          options.create_passphrase._M_string_length = 0;
          options.create_passphrase.field_2._M_local_buf[0] = '\0';
          options.verify = true;
          options.use_unsafe_sync = false;
          options.use_shared_memory = false;
          options.max_log_mb = 100;
          ReadDatabaseArgs(args,&options);
          options.require_create = true;
          options.require_format.super__Optional_base<wallet::DatabaseFormat,_true,_true>._M_payload
          .super__Optional_payload_base<wallet::DatabaseFormat>._M_payload._M_value =
               (DatabaseFormat)uVar11;
          options.require_format.super__Optional_base<wallet::DatabaseFormat,_true,_true>._M_payload
          .super__Optional_payload_base<wallet::DatabaseFormat>._4_4_ =
               SUB84((ulong)uVar11 >> 0x20,0);
          MakeDatabase((wallet *)&local_560,wallet_path,&options,&status,error);
          if (local_560 == (long *)0x0) {
            bVar4 = false;
          }
          else {
            this = (CWallet *)operator_new(0x4a8);
            local_578 = local_560;
            local_560 = (long *)0x0;
            CWallet::CWallet(this,(Chain *)0x0,name,
                             (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                              )&local_578);
            std::__shared_ptr<wallet::CWallet,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<wallet::CWallet,void(*)(wallet::CWallet*),void>
                      ((__shared_ptr<wallet::CWallet,(__gnu_cxx::_Lock_policy)2> *)&wallet,this,
                       WalletToolReleaseWallet);
            if (local_578 != (long *)0x0) {
              (**(code **)(*local_578 + 8))();
            }
            local_578 = (long *)0x0;
            args_02 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/dump.cpp"
            ;
            pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xd5;
            UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                      (&criticalblock3,
                       &(wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->cs_wallet,"wallet->cs_wallet",
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/dump.cpp"
                       ,0xd5,false);
            DVar6 = CWallet::LoadWallet(wallet.
                                        super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr);
            if (DVar6 == LOAD_OK) {
              pWVar7 = CWallet::GetDatabase
                                 (wallet.
                                  super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr);
              (*pWVar7->_vptr_WalletDatabase[0xe])(&local_580,pWVar7,1);
              (*local_580->_vptr_DatabaseBatch[0xb])();
              bVar2 = true;
              do {
                if (*(int *)((long)aiStack_268 + *(long *)(_dump_file + -0x18)) != 0) break;
                key._M_dataplus._M_p = (pointer)&key.field_2;
                key._M_string_length = 0;
                key.field_2._M_local_buf[0] = '\0';
                std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)&dump_file,(string *)&key,',');
                value._M_dataplus._M_p = (pointer)&value.field_2;
                value._M_string_length = 0;
                value.field_2._M_local_buf[0] = '\0';
                std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)&dump_file,(string *)&value,'\n');
                bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&key,"checksum");
                if (bVar4) {
                  hex_str._M_str = value._M_dataplus._M_p;
                  hex_str._M_len = value._M_string_length;
                  ParseHex<unsigned_char>(&parsed_checksum,hex_str);
                  if ((long)parsed_checksum.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)parsed_checksum.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start == 0x20) {
                    if (parsed_checksum.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish !=
                        parsed_checksum.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start) {
                      checksum.super_base_blob<256U>.m_data._M_elems._0_8_ =
                           *(undefined8 *)
                            parsed_checksum.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                      checksum.super_base_blob<256U>.m_data._M_elems._8_8_ =
                           *(undefined8 *)
                            (parsed_checksum.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start + 8);
                      checksum.super_base_blob<256U>.m_data._M_elems._16_8_ =
                           *(undefined8 *)
                            (parsed_checksum.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start + 0x10);
                      checksum.super_base_blob<256U>.m_data._M_elems._24_8_ =
                           *(undefined8 *)
                            (parsed_checksum.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start + 0x18);
                    }
                  }
                  else {
                    std::__cxx11::string::string<std::allocator<char>>
                              (local_520,"Error: Checksum is not the correct size",
                               (allocator<char> *)&line);
                    original._M_string_length._4_4_ = 0;
                    original._0_12_ = auStack_5c8;
                    original.field_2._M_allocated_capacity = (size_type)wallet_path;
                    original.field_2._8_8_ =
                         v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                         .super__Vector_impl_data._M_start;
                    Untranslated((bilingual_str *)local_398,original);
                    bilingual_str::operator=(error,(bilingual_str *)local_398);
                    bilingual_str::~bilingual_str((bilingual_str *)local_398);
                    std::__cxx11::string::~string(local_520);
                    bVar2 = false;
                  }
                  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                            (&parsed_checksum.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
                  bVar4 = true;
                }
                else {
                  pbVar9 = (bilingual_str *)&value;
                  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                            (&line,(tinyformat *)"%s,%s\n",(char *)&key,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &value,pbVar10);
                  local_398._0_8_ = line._M_dataplus._M_p;
                  local_398._8_8_ = line._M_string_length;
                  HashWriter::operator<<(&hasher,(Span<char> *)local_398);
                  bVar4 = false;
                  if ((key._M_string_length != 0) && (bVar4 = false, value._M_string_length != 0)) {
                    str_00._M_str = key._M_dataplus._M_p;
                    str_00._M_len = key._M_string_length;
                    bVar4 = IsHex(str_00);
                    if (bVar4) {
                      str_01._M_str = value._M_dataplus._M_p;
                      str_01._M_len = value._M_string_length;
                      bVar4 = IsHex(str_01);
                      if (bVar4) {
                        hex_str_00._M_str = key._M_dataplus._M_p;
                        hex_str_00._M_len = key._M_string_length;
                        ParseHex<unsigned_char>(&k,hex_str_00);
                        hex_str_01._M_str = value._M_dataplus._M_p;
                        hex_str_01._M_len = value._M_string_length;
                        ParseHex<unsigned_char>(&v,hex_str_01);
                        local_398._0_8_ =
                             k.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                        local_398._8_8_ =
                             (long)k.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)k.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                        parsed_checksum.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start =
                             v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                        parsed_checksum.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish =
                             v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish +
                             -(long)v.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                        bVar4 = DatabaseBatch::Write<Span<unsigned_char>,Span<unsigned_char>>
                                          (local_580,(Span<unsigned_char> *)local_398,
                                           (Span<unsigned_char> *)&parsed_checksum,true);
                        if (!bVar4) {
                          _((bilingual_str *)&parsed_checksum,(ConstevalStringLiteral)0x3dd15f);
                          tinyformat::format<>
                                    ((bilingual_str *)local_398,(bilingual_str *)&parsed_checksum);
                          bilingual_str::operator=(error,(bilingual_str *)local_398);
                          bilingual_str::~bilingual_str((bilingual_str *)local_398);
                          bilingual_str::~bilingual_str((bilingual_str *)&parsed_checksum);
                          bVar2 = false;
                        }
                        bVar4 = !bVar4;
                        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::
                        ~_Vector_base(&v.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     );
                        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::
                        ~_Vector_base(&k.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     );
                        goto LAB_0013e85f;
                      }
                      _((bilingual_str *)&parsed_checksum,(ConstevalStringLiteral)0x3dd139);
                      tinyformat::format<std::__cxx11::string>
                                ((bilingual_str *)local_398,(tinyformat *)&parsed_checksum,
                                 (bilingual_str *)&value,&pbVar9->original);
                    }
                    else {
                      _((bilingual_str *)&parsed_checksum,(ConstevalStringLiteral)0x3dd115);
                      tinyformat::format<std::__cxx11::string>
                                ((bilingual_str *)local_398,(tinyformat *)&parsed_checksum,
                                 (bilingual_str *)&key,&pbVar9->original);
                    }
                    bilingual_str::operator=(error,(bilingual_str *)local_398);
                    bilingual_str::~bilingual_str((bilingual_str *)local_398);
                    bilingual_str::~bilingual_str((bilingual_str *)&parsed_checksum);
                    bVar4 = true;
                    bVar2 = false;
                  }
LAB_0013e85f:
                  std::__cxx11::string::~string((string *)&line);
                }
                std::__cxx11::string::~string((string *)&value);
                std::__cxx11::string::~string((string *)&key);
              } while (!bVar4);
              if (bVar2) {
                HashWriter::GetHash((uint256 *)&key,&hasher);
                bVar4 = base_blob<256U>::IsNull(&checksum.super_base_blob<256U>);
                if (bVar4) {
                  _((bilingual_str *)local_398,(ConstevalStringLiteral)0x3dd18b);
                  pbVar9 = (bilingual_str *)local_398;
                  bilingual_str::operator=(error,pbVar9);
                }
                else {
                  bVar4 = operator!=(&checksum.super_base_blob<256U>,(base_blob<256U> *)&key);
                  if (!bVar4) goto LAB_0013ea31;
                  _((bilingual_str *)&parsed_checksum,(ConstevalStringLiteral)0x3dd1a3);
                  s.m_size = 0x20;
                  s.m_data = (uchar *)&key;
                  HexStr_abi_cxx11_(&value,s);
                  s_00.m_size = 0x20;
                  s_00.m_data = (uchar *)&checksum;
                  HexStr_abi_cxx11_(&line,s_00);
                  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                            ((bilingual_str *)local_398,(tinyformat *)&parsed_checksum,
                             (bilingual_str *)&value,&line,pbVar10);
                  bilingual_str::operator=(error,(bilingual_str *)local_398);
                  bilingual_str::~bilingual_str((bilingual_str *)local_398);
                  std::__cxx11::string::~string((string *)&line);
                  std::__cxx11::string::~string((string *)&value);
                  pbVar9 = (bilingual_str *)&parsed_checksum;
                }
                bilingual_str::~bilingual_str(pbVar9);
                bVar2 = false;
              }
LAB_0013ea31:
              (*local_580->_vptr_DatabaseBatch[(ulong)(byte)~bVar2 + 0xc])();
              pDVar3 = local_580;
              local_580 = (DatabaseBatch *)0x0;
              if (pDVar3 != (DatabaseBatch *)0x0) {
                (*pDVar3->_vptr_DatabaseBatch[5])();
              }
              std::ifstream::close();
              if (local_580 != (DatabaseBatch *)0x0) {
                (*local_580->_vptr_DatabaseBatch[5])();
              }
            }
            else {
              _((bilingual_str *)&parsed_checksum,(ConstevalStringLiteral)0x3dd0db);
              tinyformat::format<std::__cxx11::string>
                        ((bilingual_str *)local_398,(tinyformat *)&parsed_checksum,
                         (bilingual_str *)name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         args_02);
              bilingual_str::operator=(error,(bilingual_str *)local_398);
              bilingual_str::~bilingual_str((bilingual_str *)local_398);
              bilingual_str::~bilingual_str((bilingual_str *)&parsed_checksum);
              bVar2 = true;
            }
            std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock3.super_unique_lock);
            if (DVar6 == LOAD_OK) {
              std::__shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>::reset
                        (&wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>);
              bVar4 = true;
              if (!bVar2) {
                std::filesystem::remove_all((path *)wallet_path);
                goto LAB_0013eaa5;
              }
            }
            else {
LAB_0013eaa5:
              bVar4 = false;
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            if (local_560 != (long *)0x0) {
              (**(code **)(*local_560 + 8))();
            }
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::
          ~basic_string(&options.create_passphrase);
          std::__cxx11::string::~string((string *)&format_hasher_line);
        }
        std::__cxx11::string::~string((string *)&file_format);
      }
      else {
        _((bilingual_str *)local_398,(ConstevalStringLiteral)0x3dcf24);
        tinyformat::format<std::__cxx11::string>
                  ((bilingual_str *)&options,(tinyformat *)local_398,(bilingual_str *)&format_key,
                   args_01);
        bilingual_str::operator=(error,(bilingual_str *)&options);
        bilingual_str::~bilingual_str((bilingual_str *)&options);
        bilingual_str::~bilingual_str((bilingual_str *)local_398);
        std::ifstream::close();
        bVar4 = false;
      }
      std::__cxx11::string::~string((string *)&format_value);
      std::__cxx11::string::~string((string *)&format_key);
      std::__cxx11::string::~string((string *)&magic_hasher_line);
    }
    else {
      _((bilingual_str *)local_398,(ConstevalStringLiteral)0x3dce22);
      tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                ((bilingual_str *)&options,(tinyformat *)local_398,(bilingual_str *)&magic_key,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 DUMP_MAGIC_abi_cxx11_,pbVar10);
      bilingual_str::operator=(error,(bilingual_str *)&options);
      bilingual_str::~bilingual_str((bilingual_str *)&options);
      bilingual_str::~bilingual_str((bilingual_str *)local_398);
      std::ifstream::close();
LAB_0013e175:
      bVar4 = false;
    }
    std::__cxx11::string::~string((string *)&version_value);
    std::__cxx11::string::~string((string *)&magic_key);
    std::ifstream::~ifstream(&dump_file);
  }
  else {
    _((bilingual_str *)&hasher,(ConstevalStringLiteral)0x3dce05);
    std::filesystem::__cxx11::path::string((string *)&options,&dump_path.super_path);
    tinyformat::format<std::__cxx11::string>
              ((bilingual_str *)&dump_file,(tinyformat *)&hasher,(bilingual_str *)&options,psVar8);
    bilingual_str::operator=(error,(bilingual_str *)&dump_file);
    bilingual_str::~bilingual_str((bilingual_str *)&dump_file);
    std::__cxx11::string::~string((string *)&options);
    bilingual_str::~bilingual_str((bilingual_str *)&hasher);
    bVar4 = false;
  }
  std::filesystem::__cxx11::path::~path(&dump_path.super_path);
LAB_0013e1ab:
  std::__cxx11::string::~string((string *)&dump_filename);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool CreateFromDump(const ArgsManager& args, const std::string& name, const fs::path& wallet_path, bilingual_str& error, std::vector<bilingual_str>& warnings)
{
    // Get the dumpfile
    std::string dump_filename = args.GetArg("-dumpfile", "");
    if (dump_filename.empty()) {
        error = _("No dump file provided. To use createfromdump, -dumpfile=<filename> must be provided.");
        return false;
    }

    fs::path dump_path = fs::PathFromString(dump_filename);
    dump_path = fs::absolute(dump_path);
    if (!fs::exists(dump_path)) {
        error = strprintf(_("Dump file %s does not exist."), fs::PathToString(dump_path));
        return false;
    }
    std::ifstream dump_file{dump_path};

    // Compute the checksum
    HashWriter hasher{};
    uint256 checksum;

    // Check the magic and version
    std::string magic_key;
    std::getline(dump_file, magic_key, ',');
    std::string version_value;
    std::getline(dump_file, version_value, '\n');
    if (magic_key != DUMP_MAGIC) {
        error = strprintf(_("Error: Dumpfile identifier record is incorrect. Got \"%s\", expected \"%s\"."), magic_key, DUMP_MAGIC);
        dump_file.close();
        return false;
    }
    // Check the version number (value of first record)
    uint32_t ver;
    if (!ParseUInt32(version_value, &ver)) {
        error =strprintf(_("Error: Unable to parse version %u as a uint32_t"), version_value);
        dump_file.close();
        return false;
    }
    if (ver != DUMP_VERSION) {
        error = strprintf(_("Error: Dumpfile version is not supported. This version of bitcoin-wallet only supports version 1 dumpfiles. Got dumpfile with version %s"), version_value);
        dump_file.close();
        return false;
    }
    std::string magic_hasher_line = strprintf("%s,%s\n", magic_key, version_value);
    hasher << Span{magic_hasher_line};

    // Get the stored file format
    std::string format_key;
    std::getline(dump_file, format_key, ',');
    std::string format_value;
    std::getline(dump_file, format_value, '\n');
    if (format_key != "format") {
        error = strprintf(_("Error: Dumpfile format record is incorrect. Got \"%s\", expected \"format\"."), format_key);
        dump_file.close();
        return false;
    }
    // Get the data file format with format_value as the default
    std::string file_format = args.GetArg("-format", format_value);
    if (file_format.empty()) {
        error = _("No wallet file format provided. To use createfromdump, -format=<format> must be provided.");
        return false;
    }
    DatabaseFormat data_format;
    if (file_format == "bdb") {
        data_format = DatabaseFormat::BERKELEY;
    } else if (file_format == "sqlite") {
        data_format = DatabaseFormat::SQLITE;
    } else if (file_format == "bdb_swap") {
        data_format = DatabaseFormat::BERKELEY_SWAP;
    } else {
        error = strprintf(_("Unknown wallet file format \"%s\" provided. Please provide one of \"bdb\" or \"sqlite\"."), file_format);
        return false;
    }
    if (file_format != format_value) {
        warnings.push_back(strprintf(_("Warning: Dumpfile wallet format \"%s\" does not match command line specified format \"%s\"."), format_value, file_format));
    }
    std::string format_hasher_line = strprintf("%s,%s\n", format_key, format_value);
    hasher << Span{format_hasher_line};

    DatabaseOptions options;
    DatabaseStatus status;
    ReadDatabaseArgs(args, options);
    options.require_create = true;
    options.require_format = data_format;
    std::unique_ptr<WalletDatabase> database = MakeDatabase(wallet_path, options, status, error);
    if (!database) return false;

    // dummy chain interface
    bool ret = true;
    std::shared_ptr<CWallet> wallet(new CWallet(/*chain=*/nullptr, name, std::move(database)), WalletToolReleaseWallet);
    {
        LOCK(wallet->cs_wallet);
        DBErrors load_wallet_ret = wallet->LoadWallet();
        if (load_wallet_ret != DBErrors::LOAD_OK) {
            error = strprintf(_("Error creating %s"), name);
            return false;
        }

        // Get the database handle
        WalletDatabase& db = wallet->GetDatabase();
        std::unique_ptr<DatabaseBatch> batch = db.MakeBatch();
        batch->TxnBegin();

        // Read the records from the dump file and write them to the database
        while (dump_file.good()) {
            std::string key;
            std::getline(dump_file, key, ',');
            std::string value;
            std::getline(dump_file, value, '\n');

            if (key == "checksum") {
                std::vector<unsigned char> parsed_checksum = ParseHex(value);
                if (parsed_checksum.size() != checksum.size()) {
                    error = Untranslated("Error: Checksum is not the correct size");
                    ret = false;
                    break;
                }
                std::copy(parsed_checksum.begin(), parsed_checksum.end(), checksum.begin());
                break;
            }

            std::string line = strprintf("%s,%s\n", key, value);
            hasher << Span{line};

            if (key.empty() || value.empty()) {
                continue;
            }

            if (!IsHex(key)) {
                error = strprintf(_("Error: Got key that was not hex: %s"), key);
                ret = false;
                break;
            }
            if (!IsHex(value)) {
                error = strprintf(_("Error: Got value that was not hex: %s"), value);
                ret = false;
                break;
            }

            std::vector<unsigned char> k = ParseHex(key);
            std::vector<unsigned char> v = ParseHex(value);
            if (!batch->Write(Span{k}, Span{v})) {
                error = strprintf(_("Error: Unable to write record to new wallet"));
                ret = false;
                break;
            }
        }

        if (ret) {
            uint256 comp_checksum = hasher.GetHash();
            if (checksum.IsNull()) {
                error = _("Error: Missing checksum");
                ret = false;
            } else if (checksum != comp_checksum) {
                error = strprintf(_("Error: Dumpfile checksum does not match. Computed %s, expected %s"), HexStr(comp_checksum), HexStr(checksum));
                ret = false;
            }
        }

        if (ret) {
            batch->TxnCommit();
        } else {
            batch->TxnAbort();
        }

        batch.reset();

        dump_file.close();
    }
    wallet.reset(); // The pointer deleter will close the wallet for us.

    // Remove the wallet dir if we have a failure
    if (!ret) {
        fs::remove_all(wallet_path);
    }

    return ret;
}